

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O2

lys_module * ly_ctx_get_module_latest_by(ly_ctx *ctx,char *key,size_t key_offset)

{
  uint in_EAX;
  lys_module *plVar1;
  uint32_t index;
  undefined8 uStack_28;
  
  uStack_28 = (ulong)in_EAX;
  do {
    plVar1 = ly_ctx_get_module_by_iter(ctx,key,0,key_offset,(uint32_t *)((long)&uStack_28 + 4));
    if (plVar1 == (lys_module *)0x0) {
      return (lys_module *)0x0;
    }
  } while ((plVar1->latest_revision & 1) == 0);
  return plVar1;
}

Assistant:

static struct lys_module *
ly_ctx_get_module_latest_by(const struct ly_ctx *ctx, const char *key, size_t key_offset)
{
    struct lys_module *mod;
    uint32_t index = 0;

    while ((mod = ly_ctx_get_module_by_iter(ctx, key, 0, key_offset, &index))) {
        if (mod->latest_revision & LYS_MOD_LATEST_REV) {
            return mod;
        }
    }

    return NULL;
}